

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vw_exception.h
# Opt level: O3

void __thiscall
VW::vw_unrecognised_option_exception::vw_unrecognised_option_exception
          (vw_unrecognised_option_exception *this,char *file,int lineNumber,string *message)

{
  pointer pcVar1;
  string local_48;
  
  pcVar1 = (message->_M_dataplus)._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + message->_M_string_length);
  vw_exception::vw_exception(&this->super_vw_exception,file,lineNumber,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  *(undefined ***)&this->super_vw_exception = &PTR__vw_exception_002ed0a0;
  return;
}

Assistant:

vw_unrecognised_option_exception(const char* file, int lineNumber, std::string message)
      : vw_exception(file, lineNumber, message)
  {
  }